

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

int Gia_ManCheckRefinements
              (Gia_Man_t *p,Vec_Str_t *vStatus,Vec_Int_t *vOutputs,Cec_ManSim_t *pSim,int fRings)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int Counter;
  int iObj;
  int iRepr;
  int status;
  int i;
  int fRings_local;
  Cec_ManSim_t *pSim_local;
  Vec_Int_t *vOutputs_local;
  Vec_Str_t *vStatus_local;
  Gia_Man_t *p_local;
  
  iVar2 = Vec_StrSize(vStatus);
  iVar3 = Vec_IntSize(vOutputs);
  if (iVar2 << 1 == iVar3) {
    for (iRepr = 0; iVar2 = Vec_StrSize(vStatus), iRepr < iVar2; iRepr = iRepr + 1) {
      cVar1 = Vec_StrEntry(vStatus,iRepr);
      iVar2 = Vec_IntEntry(vOutputs,iRepr << 1);
      iVar3 = Vec_IntEntry(vOutputs,iRepr * 2 + 1);
      if (cVar1 != '\x01') {
        if (cVar1 == '\0') {
          Gia_ObjHasSameRepr(p,iVar2,iVar3);
        }
        else if (cVar1 == -1) {
          Cec_ManSimClassRemoveOne(pSim,iVar3);
        }
      }
    }
    return 1;
  }
  __assert_fail("2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCorr.c"
                ,0x268,
                "int Gia_ManCheckRefinements(Gia_Man_t *, Vec_Str_t *, Vec_Int_t *, Cec_ManSim_t *, int)"
               );
}

Assistant:

int Gia_ManCheckRefinements( Gia_Man_t * p, Vec_Str_t * vStatus, Vec_Int_t * vOutputs, Cec_ManSim_t * pSim, int fRings )
{
    int i, status, iRepr, iObj;
    int Counter = 0;
    assert( 2 * Vec_StrSize(vStatus) == Vec_IntSize(vOutputs) );
    Vec_StrForEachEntry( vStatus, status, i )
    {
        iRepr = Vec_IntEntry( vOutputs, 2*i );
        iObj  = Vec_IntEntry( vOutputs, 2*i+1 );
        if ( status == 1 )
            continue;
        if ( status == 0 )
        {
            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
                Counter++;
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Disproved equivalence (%d,%d) is not refined!\n", iRepr, iObj );
//            if ( Gia_ObjHasSameRepr(p, iRepr, iObj) )
//                Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
        if ( status == -1 )
        {
//            if ( !Gia_ObjFailed( p, iObj ) )
//                Abc_Print( 1, "Gia_ManCheckRefinements(): Failed equivalence is not marked as failed!\n" );
//            Gia_ObjSetFailed( p, iRepr );
//            Gia_ObjSetFailed( p, iObj );        
//            if ( fRings )
//            Cec_ManSimClassRemoveOne( pSim, iRepr );
            Cec_ManSimClassRemoveOne( pSim, iObj );
            continue;
        }
    }
//    if ( Counter )
//    Abc_Print( 1, "Gia_ManCheckRefinements(): Could not refine %d nodes.\n", Counter );
    return 1;
}